

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::number::impl::CurrencySymbols::loadSymbol
          (UnicodeString *__return_storage_ptr__,CurrencySymbols *this,UCurrNameStyle selector,
          UErrorCode *status)

{
  undefined1 *currency;
  UBool ignoredIsChoiceFormatFillIn;
  int32_t symbolLen;
  UBool local_2d;
  int32_t local_2c;
  ConstChar16Ptr local_28 [3];
  
  local_2d = '\0';
  local_2c = 0;
  currency = &(this->fCurrency).super_MeasureUnit.field_0x14;
  local_28[0].p_ =
       ucurr_getName_63((UChar *)currency,(this->fLocaleName).buffer.ptr,selector,&local_2d,
                        &local_2c,status);
  if (local_28[0].p_ == (char16_t *)currency) {
    UnicodeString::UnicodeString(__return_storage_ptr__,(UChar *)currency,3);
  }
  else {
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_28,local_2c);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CurrencySymbols::loadSymbol(UCurrNameStyle selector, UErrorCode& status) const {
    const char16_t* isoCode = fCurrency.getISOCurrency();
    UBool ignoredIsChoiceFormatFillIn = FALSE;
    int32_t symbolLen = 0;
    const char16_t* symbol = ucurr_getName(
            isoCode,
            fLocaleName.data(),
            selector,
            &ignoredIsChoiceFormatFillIn,
            &symbolLen,
            &status);
    // If given an unknown currency, ucurr_getName returns the input string, which we can't alias safely!
    // Otherwise, symbol points to a resource bundle, and we can use readonly-aliasing constructor.
    if (symbol == isoCode) {
        return UnicodeString(isoCode, 3);
    } else {
        return UnicodeString(TRUE, symbol, symbolLen);
    }
}